

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
             ,Dispatch_State *t_ss)

{
  uint *puVar1;
  Type_Conversions *pTVar2;
  Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>> *this_00;
  __atomic_base<unsigned_long> _Var3;
  long lVar4;
  size_t __n;
  size_t sVar5;
  Dispatch_Engine *pDVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int iVar8;
  int iVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
  *type;
  pointer ppVar10;
  Dispatch_State *in_RDX;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *extraout_RDX;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *extraout_RDX_00;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  char *__s2;
  Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *pMVar11;
  Boxed_Value BVar12;
  string_view name;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Type_Info type_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t_param_names;
  undefined1 local_189;
  undefined1 local_188 [16];
  undefined1 local_178 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  Param_Types local_138;
  undefined1 local_118 [32];
  undefined1 local_f8 [16];
  pointer local_e8;
  Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *local_e0;
  string *local_d8;
  int local_cc;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  __atomic_base<unsigned_long> local_a8;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_80;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  
  local_a0.m_key =
       (void *)((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align;
  local_188._0_8_ = (Dispatch_Engine *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"this","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_188;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l,(allocator_type *)&local_138);
  t_node = extraout_RDX;
  if ((Dispatch_Engine *)local_188._0_8_ != (Dispatch_Engine *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
    t_node = extraout_RDX_00;
  }
  local_138.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = '\0';
  local_138.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_138.m_has_types = false;
  local_138.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
  local_138.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  pTVar2 = t_ss[2].m_conversions.m_conversions._M_data;
  if ((0x10 < (ulong)((long)t_ss[2].m_conversions.m_saves._M_data - (long)pTVar2)) &&
     (this_00 = *(Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                  **)((long)&(pTVar2->m_mutex)._M_impl._M_rwlock + 0x10), *(int *)(this_00 + 8) == 3
     )) {
    Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::
    get_arg_names_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_178 + 0x20),this_00,t_node);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               local_158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
    get_arg_types((Param_Types *)local_188,
                  *(AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                    **)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                               _M_rwlock + 0x10),in_RDX);
    local_118._0_8_ =
         local_138.m_types.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_118._16_8_ =
         CONCAT71(local_138.m_types.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                  local_138.m_types.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_138.m_types.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = (undefined1)local_178._0_8_;
    local_138.m_types.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = SUB87(local_178._0_8_,1);
    local_118._8_8_ =
         CONCAT71(local_138.m_types.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  local_138.m_types.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    local_138.m_types.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._0_8_;
    local_138.m_types.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)local_188._8_8_;
    local_138.m_types.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = SUB87(local_188._8_8_,1);
    local_188._0_8_ = (Dispatch_Engine *)0x0;
    local_188._8_8_ = (pointer)0x0;
    local_178._0_8_ = 0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
               *)local_118);
    local_138.m_has_types = (bool)local_178[8];
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
               *)local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_178 + 0x20));
  }
  local_c8.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_c8.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var3._M_i = (__int_type)(in_RDX->m_engine)._M_data;
  iVar9 = (int)((long)local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5);
  if (t_ss[3].m_conversions.m_saves._M_data != (Conversion_Saves *)0x0) {
    local_188._0_8_ = _Var3._M_i;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_188 + 8),&local_98);
    local_178._16_8_ = t_ss[3].m_conversions.m_saves._M_data;
    local_178._24_8_ = t_ss[4].m_engine._M_data;
    if ((Dispatch_Engine *)local_178._24_8_ != (Dispatch_Engine *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        puVar1 = &(((Dispatch_Engine *)local_178._24_8_)->m_mutex)._M_impl._M_rwlock.__data.
                  __wrphase_futex;
        *puVar1 = *puVar1 + 1;
        UNLOCK();
      }
      else {
        puVar1 = &(((Dispatch_Engine *)local_178._24_8_)->m_mutex)._M_impl._M_rwlock.__data.
                  __wrphase_futex;
        *puVar1 = *puVar1 + 1;
      }
    }
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_158.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar9);
    make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_1_>,chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_1_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&>
              ((chaiscript *)local_118,(anon_class_48_3_e1829392_for_m_f *)local_188,
               (int *)(local_178 + 0x20),
               (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                *)&t_ss[3].m_conversions.m_saves);
    _Var7._M_pi = local_c8.
                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_c8.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
    local_c8.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_118._0_8_;
    local_118._0_8_ = (Dispatch_Engine *)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((_Base_ptr)_Var7._M_pi != (_Base_ptr)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    if ((Dispatch_Engine *)local_178._24_8_ != (Dispatch_Engine *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._24_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_188 + 8));
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_a0.m_key + 0x10);
  lVar4 = *(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                           _M_rwlock + 8);
  __n = *(size_t *)(lVar4 + 0x18);
  local_d8 = (string *)(lVar4 + 0x10);
  sVar5 = *(size_t *)((long)local_a0.m_key + 0x18);
  local_e0 = this;
  local_a8._M_i = _Var3._M_i;
  if (__n == sVar5) {
    __s2 = (local_b0->_M_dataplus)._M_p;
    if ((__n == 0) || (iVar8 = bcmp((local_d8->_M_dataplus)._M_p,__s2,__n), iVar8 == 0)) {
      local_50._M_allocated_capacity = (size_type)(pointer)&local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,__s2,__s2 + __n);
      local_f8._0_8_ = &Type_Info::Unknown_Type::typeinfo;
      local_f8._8_8_ = &Type_Info::Unknown_Type::typeinfo;
      local_e8 = (pointer)0x20;
      std::
      vector<std::pair<std::__cxx11::string,chaiscript::Type_Info>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Type_Info>>>
      ::_M_emplace_aux<std::__cxx11::string,chaiscript::Type_Info&>
                ((vector<std::pair<std::__cxx11::string,chaiscript::Type_Info>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Type_Info>>>
                  *)&local_138,
                 (const_iterator)
                 local_138.m_types.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                 (Type_Info *)local_f8);
      for (ppVar10 = local_138.m_types.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 !=
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
           *)CONCAT71(local_138.m_types.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                      local_138.m_types.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_1_); ppVar10 = ppVar10 + 1) {
        if ((ppVar10->first)._M_string_length != 0) {
          local_138.m_has_types = true;
          goto LAB_00342afc;
        }
      }
      local_138.m_has_types = false;
LAB_00342afc:
      if ((pointer)local_50._M_allocated_capacity != (pointer)&local_40) {
        operator_delete((void *)local_50._M_allocated_capacity,(ulong)(local_40._M_p + 1));
      }
      pDVar6 = (in_RDX->m_engine)._M_data;
      local_188._0_8_ = local_a8._M_i;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_188 + 8),&local_98);
      local_178._16_8_ = t_ss[3].m_stack_holder._M_data;
      local_178._24_8_ = t_ss[3].m_conversions.m_conversions._M_data;
      if ((Type_Conversions *)local_178._24_8_ != (Type_Conversions *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar1 = &(((Type_Conversions *)local_178._24_8_)->m_mutex)._M_impl._M_rwlock.__data.
                    __wrphase_futex;
          *puVar1 = *puVar1 + 1;
          UNLOCK();
        }
        else {
          puVar1 = &(((Type_Conversions *)local_178._24_8_)->m_mutex)._M_impl._M_rwlock.__data.
                    __wrphase_futex;
          *puVar1 = *puVar1 + 1;
        }
      }
      local_80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._0_4_ = iVar9;
      make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_2_>,chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_2_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&,chaiscript::dispatch::Param_Types&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>&>
                ((chaiscript *)local_f8,(anon_class_48_3_baf6a18f_for_m_f *)local_188,
                 (int *)&local_80,
                 (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                  *)&t_ss[3].m_stack_holder,&local_138,&local_c8);
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chaiscript::dispatch::detail::Dynamic_Object_Constructor,std::allocator<chaiscript::dispatch::detail::Dynamic_Object_Constructor>,std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_158.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data + 8),
                 (Dynamic_Object_Constructor **)(local_178 + 0x20),
                 (allocator<chaiscript::dispatch::detail::Dynamic_Object_Constructor> *)&local_cc,
                 local_b0,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_f8);
      local_118._0_8_ =
           local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_118._8_8_ =
           local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      chaiscript::detail::Dispatch_Engine::add_function(pDVar6,(Proxy_Function *)local_118,local_d8)
      ;
      pMVar11 = local_e0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
      local_80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
      if (local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_158.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        local_80.
        super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
      }
      goto LAB_00342c24;
    }
  }
  else {
    __s2 = (local_b0->_M_dataplus)._M_p;
  }
  name._M_str = __s2;
  name._M_len = sVar5;
  chaiscript::detail::Dispatch_Engine::get_type
            ((Type_Info *)local_118,(in_RDX->m_engine)._M_data,name,false);
  local_70._0_8_ = (pointer)(local_70 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,*(long *)((long)local_a0.m_key + 0x10),
             *(long *)((long)local_a0.m_key + 0x18) + *(long *)((long)local_a0.m_key + 0x10));
  local_e8 = (pointer)local_118._16_8_;
  local_f8._0_8_ = local_118._0_8_;
  local_f8._8_8_ = local_118._8_8_;
  std::
  vector<std::pair<std::__cxx11::string,chaiscript::Type_Info>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Type_Info>>>
  ::_M_emplace_aux<std::__cxx11::string,chaiscript::Type_Info&>
            ((vector<std::pair<std::__cxx11::string,chaiscript::Type_Info>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Type_Info>>>
              *)&local_138,
             (const_iterator)
             local_138.m_types.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             (Type_Info *)local_f8);
  for (ppVar10 = local_138.m_types.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVar10 !=
      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
       *)CONCAT71(local_138.m_types.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  local_138.m_types.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_); ppVar10 = ppVar10 + 1) {
    if ((ppVar10->first)._M_string_length != 0) {
      local_138.m_has_types = true;
      goto LAB_003429b8;
    }
  }
  local_138.m_has_types = false;
LAB_003429b8:
  if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
  }
  pDVar6 = (in_RDX->m_engine)._M_data;
  local_188._0_8_ = local_a8._M_i;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_188 + 8),&local_98);
  local_178._16_8_ = t_ss[3].m_stack_holder._M_data;
  local_178._24_8_ = t_ss[3].m_conversions.m_conversions._M_data;
  if ((Type_Conversions *)local_178._24_8_ != (Type_Conversions *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = &(((Type_Conversions *)local_178._24_8_)->m_mutex)._M_impl._M_rwlock.__data.
                __wrphase_futex;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
    }
    else {
      puVar1 = &(((Type_Conversions *)local_178._24_8_)->m_mutex)._M_impl._M_rwlock.__data.
                __wrphase_futex;
      *puVar1 = *puVar1 + 1;
    }
  }
  local_cc = iVar9;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_3_>,chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_3_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&,chaiscript::dispatch::Param_Types&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>&>
            ((chaiscript *)&local_80,(anon_class_48_3_baf6a18f_for_m_f *)local_188,&local_cc,
             (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
              *)&t_ss[3].m_stack_holder,&local_138,&local_c8);
  local_f8._0_8_ = (Dynamic_Object_Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::detail::Dynamic_Object_Function,std::allocator<chaiscript::dispatch::detail::Dynamic_Object_Function>,std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::Type_Info&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8),
             (Dynamic_Object_Function **)local_f8,
             (allocator<chaiscript::dispatch::detail::Dynamic_Object_Function> *)&local_189,local_b0
             ,&local_80,(Type_Info *)local_118);
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
  local_f8._0_8_ = (Dynamic_Object_Function *)0x0;
  local_f8._8_8_ = (_Base_ptr)0x0;
  chaiscript::detail::Dispatch_Engine::add_function
            (pDVar6,(Proxy_Function *)(local_178 + 0x20),local_d8);
  pMVar11 = local_e0;
  if (local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((_Base_ptr)local_f8._8_8_ != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
LAB_00342c24:
  if ((_Base_ptr)
      local_80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((Type_Conversions *)local_178._24_8_ != (Type_Conversions *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._24_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_188 + 8));
  if ((void_var()::v == '\0') && (iVar9 = __cxa_guard_acquire(&void_var()::v), iVar9 != 0)) {
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    (void_var::v.m_data.
     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count = 1;
    (void_var::v.m_data.
     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_weak_count = 1;
    (void_var::v.m_data.
     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_003c4838;
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              (void_var::v.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 1);
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&void::typeinfo;
    *(undefined **)
     &void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[1]._M_use_count = &void::typeinfo;
    *(undefined4 *)
     &void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._vptr__Sp_counted_base = 8;
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[2]._M_use_count = 0;
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[2]._M_weak_count = 0;
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[3]._M_use_count = 0;
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[3]._M_weak_count = 0;
    void_var::v.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined2 *)
     &void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_use_count = 0;
    __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
    __cxa_guard_release(&void_var()::v);
    pMVar11 = local_e0;
  }
  (pMVar11->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
  super_AST_Node._vptr_AST_Node =
       (_func_int **)
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var7 = void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(pMVar11->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
    super_AST_Node.identifier =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var7._M_pi)->_M_use_count = (_Var7._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var7._M_pi)->_M_use_count = (_Var7._M_pi)->_M_use_count + 1;
    }
  }
  if ((_Base_ptr)
      local_c8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector(&local_138.m_types);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX_01._M_pi;
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)pMVar11;
  return (Boxed_Value)
         BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        AST_Node_Impl_Ptr<T> guardnode;

        const std::string &class_name = this->children[0]->text;

        // The first param of a method is always the implied this ptr.
        std::vector<std::string> t_param_names{"this"};
        dispatch::Param_Types param_types;

        if ((this->children.size() > 2) && (this->children[2]->identifier == AST_Node_Type::Arg_List)) {
          auto args = Arg_List_AST_Node<T>::get_arg_names(*this->children[2]);
          t_param_names.insert(t_param_names.end(), args.begin(), args.end());
          param_types = Arg_List_AST_Node<T>::get_arg_types(*this->children[2], t_ss);
        }

        const size_t numparams = t_param_names.size();

        std::shared_ptr<dispatch::Proxy_Function_Base> guard;
        std::reference_wrapper<chaiscript::detail::Dispatch_Engine> engine(*t_ss);
        if (m_guard_node) {
          guard = dispatch::make_dynamic_proxy_function(
              [engine, t_param_names, guardnode = m_guard_node](const Function_Params &t_params) {
                return chaiscript::eval::detail::eval_function(engine, *guardnode, t_param_names, t_params);
              },
              static_cast<int>(numparams),
              m_guard_node);
        }

        try {
          const std::string &function_name = this->children[1]->text;

          if (function_name == class_name) {
            param_types.push_front(class_name, Type_Info());

            t_ss->add(std::make_shared<dispatch::detail::Dynamic_Object_Constructor>(
                          class_name,
                          dispatch::make_dynamic_proxy_function(
                              [engine, t_param_names, node = m_body_node](const Function_Params &t_params) {
                                return chaiscript::eval::detail::eval_function(engine, *node, t_param_names, t_params);
                              },
                              static_cast<int>(numparams),
                              m_body_node,
                              param_types,
                              guard)),
                      function_name);

          } else {
            // if the type is unknown, then this generates a function that looks up the type
            // at runtime. Defining the type first before this is called is better
            auto type = t_ss->get_type(class_name, false);
            param_types.push_front(class_name, type);

            t_ss->add(std::make_shared<dispatch::detail::Dynamic_Object_Function>(
                          class_name,
                          dispatch::make_dynamic_proxy_function(
                              [engine, t_param_names, node = m_body_node](const Function_Params &t_params) {
                                return chaiscript::eval::detail::eval_function(engine, *node, t_param_names, t_params);
                              },
                              static_cast<int>(numparams),
                              m_body_node,
                              param_types,
                              guard),
                          type),
                      function_name);
          }
        } catch (const exception::name_conflict_error &e) {
          throw exception::eval_error("Method redefined '" + e.name() + "'");
        }
        return void_var();
      }